

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O1

char * __cxxabiv1::anon_unknown_0::parse_source_name<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  pointer pcVar6;
  size_type extraout_RDX;
  size_t __n;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  size_type __old_capacity;
  ulong uVar7;
  bool bVar8;
  String r;
  size_type __dnew;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *local_98;
  pointer local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  local_88;
  value_type local_78;
  _Alloc_hider local_38;
  
  if (((first != last) && ((int)*first - 0x30U < 10)) && (pcVar4 = first + 1, pcVar4 != last)) {
    uVar7 = (ulong)((int)*first - 0x30U);
    iVar5 = (int)*pcVar4;
    if (0xfffffff5 < iVar5 - 0x3aU) {
      pcVar3 = first + 2;
      do {
        pcVar4 = pcVar3;
        if (pcVar4 == last) {
          return first;
        }
        uVar7 = (ulong)(iVar5 - 0x30) + uVar7 * 10;
        iVar5 = (int)*pcVar4;
        pcVar3 = pcVar4 + 1;
      } while (0xfffffff5 < iVar5 - 0x3aU);
    }
    if (uVar7 <= (ulong)((long)last - (long)pcVar4)) {
      first = pcVar4 + uVar7;
      local_98 = &local_88;
      std::__cxx11::
      basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
      ::_M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                  *)&local_98,pcVar4,first);
      paVar1 = &local_78.first.field_2;
      pcVar6 = (pointer)0xa;
      if (local_90 < (pointer)0xa) {
        pcVar6 = local_90;
      }
      local_78.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::
      basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
      ::_M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                  *)&local_78,local_98,pcVar6 + (long)local_98);
      if (local_78.first._M_string_length == 0) {
        bVar8 = true;
        __old_capacity = extraout_RDX;
      }
      else {
        __n = 10;
        if (local_78.first._M_string_length < 10) {
          __n = local_78.first._M_string_length;
        }
        iVar5 = bcmp(local_78.first._M_dataplus._M_p,"_GLOBAL__N",__n);
        bVar8 = iVar5 == 0;
        __old_capacity = extraout_RDX_00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_78.first._M_dataplus._M_p != paVar1) {
        free(local_78.first._M_dataplus._M_p);
        __old_capacity = extraout_RDX_01;
      }
      pcVar6 = local_90;
      if ((bool)(local_78.first._M_string_length == 10 & bVar8)) {
        local_38._M_p = (pointer)0x15;
        local_78.first._M_dataplus._M_p = (pointer)paVar1;
        local_78.first._M_dataplus._M_p =
             std::__cxx11::
             basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
             ::_M_create((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                          *)&local_38,(size_type *)0x0,__old_capacity);
        paVar2 = &local_78.second.field_2;
        local_78.first.field_2._M_allocated_capacity = (size_type)local_38._M_p;
        *(undefined8 *)local_78.first._M_dataplus._M_p = 0x6f6d796e6f6e6128;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 8) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 9) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 10) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 0xb) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 0xc) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 0xd) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 0xe) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 0xf) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 0xd) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 0xe) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 0xf) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 0x10) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 0x11) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 0x12) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 0x13) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_78.first._M_dataplus._M_p + 0x14) = ')';
        local_78.first._M_string_length = (size_type)local_38._M_p;
        local_78.first._M_dataplus._M_p[local_38._M_p] = '\0';
        local_78.second._M_string_length = 0;
        local_78.second.field_2._M_local_buf[0] = '\0';
        local_78.second._M_dataplus._M_p = (pointer)paVar2;
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_78.second._M_dataplus._M_p != paVar2) {
          free(local_78.second._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_78.first._M_dataplus._M_p != paVar1) {
          free(local_78.first._M_dataplus._M_p);
        }
      }
      else {
        if (local_98 == &local_88) {
          local_a8._8_8_ = local_88._8_8_;
          local_b8 = &local_a8;
        }
        else {
          local_b8 = local_98;
        }
        local_a8._M_allocated_capacity._1_7_ = local_88._M_allocated_capacity._1_7_;
        local_a8._M_local_buf[0] = local_88._M_local_buf[0];
        local_90 = (pointer)0x0;
        local_88._M_local_buf[0] = '\0';
        if (local_b8 == &local_a8) {
          local_78.first.field_2._8_8_ = local_a8._8_8_;
          local_78.first._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_78.first._M_dataplus._M_p = (pointer)local_b8;
        }
        local_78.first.field_2._M_allocated_capacity = local_a8._M_allocated_capacity;
        paVar2 = &local_78.second.field_2;
        local_78.first._M_string_length = (size_type)pcVar6;
        local_a8._M_allocated_capacity = (ulong)(uint7)local_88._M_allocated_capacity._1_7_ << 8;
        local_78.second._M_string_length = 0;
        local_78.second.field_2._M_local_buf[0] = '\0';
        local_98 = &local_88;
        local_78.second._M_dataplus._M_p = (pointer)paVar2;
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_78.second._M_dataplus._M_p != paVar2) {
          free(local_78.second._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_78.first._M_dataplus._M_p != paVar1) {
          free(local_78.first._M_dataplus._M_p);
        }
      }
      if (local_98 != &local_88) {
        free(local_98);
      }
    }
  }
  return first;
}

Assistant:

const char*
parse_source_name(const char* first, const char* last, C& db)
{
    if (first != last)
    {
        char c = *first;
        if (isdigit(c) && first+1 != last)
        {
            const char* t = first+1;
            size_t n = static_cast<size_t>(c - '0');
            for (c = *t; isdigit(c); c = *t)
            {
                n = n * 10 + static_cast<size_t>(c - '0');
                if (++t == last)
                    return first;
            }
            if (static_cast<size_t>(last - t) >= n)
            {
                typename C::String r(t, n);
                if (r.substr(0, 10) == "_GLOBAL__N")
                    db.names.push_back("(anonymous namespace)");
                else
                    db.names.push_back(std::move(r));
                first = t + n;
            }
        }
    }
    return first;
}